

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Acceptor.cpp
# Opt level: O1

int Acceptor::setSocketNonBlocking(int fd)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = fcntl(fd,3,0);
  if (uVar1 == 0xffffffff) {
    iVar2 = -1;
  }
  else {
    iVar2 = fcntl(fd,4,(ulong)(uVar1 | 0x800));
    iVar2 = -(uint)(iVar2 == -1);
  }
  return iVar2;
}

Assistant:

int Acceptor::setSocketNonBlocking(int fd)
{
	int flag = fcntl(fd, F_GETFL, 0);
  	if (flag == -1)
	       	return -1;
	flag |= O_NONBLOCK;
  	if (fcntl(fd, F_SETFL, flag) == -1) 
		return -1;
  	return 0;
}